

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

opj_bool allocate_buffers(opj_t1_t *t1,int w,int h)

{
  int *piVar1;
  flag_t *pfVar2;
  int iVar3;
  
  iVar3 = h * w;
  if (t1->datasize < iVar3) {
    free(t1->data);
    piVar1 = (int *)malloc((long)iVar3 * 4);
    t1->data = piVar1;
    if (piVar1 == (int *)0x0) {
      return 0;
    }
    t1->datasize = iVar3;
  }
  memset(t1->data,0,(long)iVar3 << 2);
  t1->flags_stride = w + 2;
  iVar3 = (h + 2) * (w + 2);
  if (t1->flagssize < iVar3) {
    free(t1->flags);
    pfVar2 = (flag_t *)malloc((long)iVar3 * 2);
    t1->flags = pfVar2;
    if (pfVar2 == (flag_t *)0x0) {
      return 0;
    }
    t1->flagssize = iVar3;
  }
  memset(t1->flags,0,(long)iVar3 * 2);
  t1->w = w;
  t1->h = h;
  return 1;
}

Assistant:

static opj_bool allocate_buffers(
		opj_t1_t *t1,
		int w,
		int h)
{
	int datasize=w * h;
	int flagssize;

	if(datasize > t1->datasize){
		opj_aligned_free(t1->data);
		t1->data = (int*) opj_aligned_malloc(datasize * sizeof(int));
		if(!t1->data){
			return OPJ_FALSE;
		}
		t1->datasize=datasize;
	}
	memset(t1->data,0,datasize * sizeof(int));

	t1->flags_stride=w+2;
	flagssize=t1->flags_stride * (h+2);

	if(flagssize > t1->flagssize){
		opj_aligned_free(t1->flags);
		t1->flags = (flag_t*) opj_aligned_malloc(flagssize * sizeof(flag_t));
		if(!t1->flags){
			return OPJ_FALSE;
		}
		t1->flagssize=flagssize;
	}
	memset(t1->flags,0,flagssize * sizeof(flag_t));

	t1->w=w;
	t1->h=h;

	return OPJ_TRUE;
}